

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.h
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FieldGroup::FieldGroup
          (FieldGroup *this,float preferred_location,FieldDescriptor *field,uint64_t num_accesses)

{
  uint32_t uVar1;
  allocator_type local_1d;
  float local_1c;
  FieldDescriptor *field_local;
  
  local_1c = preferred_location;
  field_local = field;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&this->fields_,1,&field_local,&local_1d);
  this->preferred_location_ = local_1c;
  uVar1 = EstimateAlignmentSize(field_local);
  this->estimated_memory_size_ = uVar1;
  return;
}

Assistant:

FieldGroup(float preferred_location, const FieldDescriptor* field,
             uint64_t num_accesses = 0)
      : fields_(1, field),
        preferred_location_(preferred_location),
        estimated_memory_size_(
            static_cast<uint32_t>(EstimateAlignmentSize(field))) {
  }